

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O1

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,shared_ptr<nigel::AstTerm> *cExpr,
          int priority)

{
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  element_type *peVar1;
  bool bVar2;
  AST_Parser *pAVar3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int in_R8D;
  bool bVar7;
  bool bVar8;
  shared_ptr<nigel::AstReturning> sVar9;
  shared_ptr<nigel::AstExpr> clTerm;
  undefined1 local_88 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  AST_Parser *local_58;
  _func_int **local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  local_68 = (element_type *)CONCAT44(in_register_0000000c,priority);
  local_88._16_8_ = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  p_Var6 = &(cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal;
  local_58 = this;
LAB_001390dd:
  bVar7 = (((cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_AstReturning).super_AstExpr.type == term;
  if (bVar7) {
    AstExpr::as<nigel::AstTerm>((AstExpr *)&local_40);
    pmVar4 = std::
             map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             ::operator[](this_00,(key_type *)&local_40._M_pi[5]._M_use_count);
    if (in_R8D <= *pmVar4) goto LAB_00139113;
    bVar7 = true;
    bVar2 = false;
    bVar8 = true;
  }
  else {
LAB_00139113:
    local_88._0_4_ = op_set;
    pmVar4 = std::
             map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             ::operator[](this_00,(key_type *)local_88);
    if (*pmVar4 == in_R8D) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)&local_50);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_50 + 0xb));
      bVar8 = *pmVar4 == in_R8D;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar8 = false;
    }
  }
  if ((bVar2) && (local_48 != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if ((bVar7) && (local_38 != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  peVar1 = (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (bVar8) {
    local_88._16_8_ = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,p_Var6);
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
    (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(CONCAT44(local_88._4_4_,local_88._0_4_) + 0x48);
    __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          (CONCAT44(local_88._4_4_,local_88._0_4_) + 0x50);
  }
  else {
    if ((peVar1->super_AstReturning).super_AstExpr.type != returnStat) goto LAB_00139205;
    local_88._16_8_ = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,p_Var6);
    AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_88);
    (cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(CONCAT44(local_88._4_4_,local_88._0_4_) + 0x30);
    __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          (CONCAT44(local_88._4_4_,local_88._0_4_) + 0x38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var6,__r);
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  goto LAB_001390dd;
LAB_00139205:
  if ((element_type *)local_88._16_8_ == (element_type *)0x0) {
    ((__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)
    &local_60._M_pi[0xb]._vptr__Sp_counted_base)->_M_ptr = (element_type *)local_68->_vptr_Token;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_pi[0xb]._M_use_count,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_68->super_enable_shared_from_this<nigel::Token>);
  }
  else {
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._16_8_ + 0x10))->_M_use_count ==
        0x12) {
      AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_88);
      *(_func_int ***)(CONCAT44(local_88._4_4_,local_88._0_4_) + 0x30) = local_68->_vptr_Token;
      p_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(local_88._4_4_,local_88._0_4_) + 0x38);
    }
    else {
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._16_8_ + 0x10))->_M_use_count
          != 2) goto LAB_00139298;
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
      *(_func_int ***)(CONCAT44(local_88._4_4_,local_88._0_4_) + 0x48) = local_68->_vptr_Token;
      p_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(local_88._4_4_,local_88._0_4_) + 0x50);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var6,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &local_68->super_enable_shared_from_this<nigel::Token>);
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  }
LAB_00139298:
  pAVar3 = local_58;
  sVar9 = AstExpr::as<nigel::AstReturning>((AstExpr *)local_58);
  _Var5 = sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    _Var5._M_pi = extraout_RDX;
  }
  sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pAVar3;
  return (shared_ptr<nigel::AstReturning>)
         sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstTerm> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;//Should be a term or a return statement
		while( true )
		{//Split all possible (unatomic) expressions
			if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::returnStat )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstReturnStatement>()->expr;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::term )
				clTerm->as<AstTerm>()->rVal = cExpr;
			else if( clTerm->type == AstExpr::Type::returnStat )
				clTerm->as<AstReturnStatement>()->expr = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}